

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

usize __thiscall Console::Prompt::Private::getScreenWidth(Private *this)

{
  int iVar1;
  ssize_t sVar2;
  char *__buf;
  usize uVar3;
  usize uVar4;
  usize newX;
  usize x;
  String moveCmd;
  usize newY;
  usize y;
  winsize ws;
  
  iVar1 = ioctl(originalStdout,0x5413,&ws);
  if (ws.ws_col != 0 && iVar1 == 0) {
    return (ulong)ws.ws_col;
  }
  getCursorPosition(this,&x,&y);
  sVar2 = write(originalStdout,"\x1b[999C",6);
  if (sVar2 == 6) {
    getCursorPosition(this,&newX,&newY);
    if (x < newX) {
      moveCmd.data = &String::emptyData.super_Data;
      String::printf(&moveCmd,"\x1b[%dD",(ulong)(uint)((int)newX - (int)x));
      iVar1 = originalStdout;
      __buf = String::operator_cast_to_char_(&moveCmd);
      uVar3 = write(iVar1,__buf,(moveCmd.data)->len);
      uVar4 = (moveCmd.data)->len;
      String::~String(&moveCmd);
      if (uVar3 != uVar4) goto LAB_00108d8f;
    }
    uVar4 = newX + 1;
  }
  else {
LAB_00108d8f:
    uVar4 = 0x50;
  }
  return uVar4;
}

Assistant:

usize getScreenWidth()
  {
#ifdef _MSC_VER
    CONSOLE_SCREEN_BUFFER_INFO csbi;
    VERIFY(GetConsoleScreenBufferInfo(hOriginalStdOut, &csbi));
    return csbi.dwSize.X;
#else
    winsize ws;
    if(ioctl(originalStdout, TIOCGWINSZ, &ws) == 0)
      if(ws.ws_col)
        return ws.ws_col;
    usize x, y;
    getCursorPosition(x, y);
    if(write(originalStdout, "\x1b[999C", 6) != 6)
      return 80;
    usize newX, newY;
    getCursorPosition(newX, newY);
    if(newX > x)
    {
      String moveCmd;
      moveCmd.printf("\x1b[%dD", (int)(newX - x));
      if(write(originalStdout, (const char*)moveCmd, moveCmd.length()) != (ssize)moveCmd.length())
        return 80;
    }
    return newX + 1;
#endif
  }